

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryEntry.h
# Opt level: O3

bool __thiscall
JsUtil::
CacheHashedEntry<Memory::WriteBarrierPtr<Js::JavascriptString>,Js::SimpleDictionaryPropertyDescriptor<int>,JsUtil::(anonymous_namespace)::KeyValueEntry>
::KeyEquals<Js::PropertyRecordStringHashComparer<Js::JavascriptString*>,Js::JavascriptString*>
          (CacheHashedEntry<Memory::WriteBarrierPtr<Js::JavascriptString>,Js::SimpleDictionaryPropertyDescriptor<int>,JsUtil::(anonymous_namespace)::KeyValueEntry>
           *this,JavascriptString **otherKey,hash_t otherHashCode)

{
  JavascriptString *pJVar1;
  JavascriptString *this_00;
  code *pcVar2;
  bool bVar3;
  charcount_t cVar4;
  hash_t hVar5;
  charcount_t cVar6;
  int iVar7;
  char16 *pcVar8;
  undefined4 *puVar9;
  char16 *string2;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  
  pJVar1 = *(JavascriptString **)(this + 0x10);
  pcVar8 = Js::JavascriptString::GetString(pJVar1);
  cVar4 = Js::JavascriptString::GetLength(pJVar1);
  if (cVar4 == 0) {
    hVar5 = 0x2393b8b;
  }
  else {
    uVar11 = 0x811c9dc5;
    uVar10 = 0;
    do {
      uVar12 = (ushort)pcVar8[uVar10] ^ uVar11;
      uVar11 = uVar12 * 0x1000193;
      uVar10 = uVar10 + 1;
    } while (cVar4 != uVar10);
    hVar5 = uVar12 * 0x2000326 + 1;
  }
  if (hVar5 != *(hash_t *)(this + 0x18)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DictionaryEntry.h"
                       ,199,
                       "(((static_cast<hash_t>(Comparer::GetHashCode(this->Key())) << 1) | 1) == this->hashCode)"
                       ,"TAGHASH(Comparer::GetHashCode(this->Key())) == this->hashCode");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar9 = 0;
    hVar5 = *(hash_t *)(this + 0x18);
  }
  if (hVar5 == otherHashCode) {
    pJVar1 = *(JavascriptString **)(this + 0x10);
    this_00 = *otherKey;
    cVar4 = Js::JavascriptString::GetLength(pJVar1);
    cVar6 = Js::JavascriptString::GetLength(this_00);
    if (cVar4 == cVar6) {
      pcVar8 = Js::JavascriptString::GetString(pJVar1);
      string2 = Js::JavascriptString::GetString(this_00);
      cVar4 = Js::JavascriptString::GetLength(pJVar1);
      if (pcVar8 != string2) {
        iVar7 = PAL_wmemcmp(pcVar8,string2,(ulong)cVar4);
        return iVar7 == 0;
      }
      return true;
    }
  }
  return false;
}

Assistant:

inline bool KeyEquals(TLookup const& otherKey, hash_t otherHashCode)
        {
            Assert(TAGHASH(Comparer::GetHashCode(this->Key())) == this->hashCode);
            return this->hashCode == otherHashCode && Comparer::Equals(this->Key(), otherKey);
        }